

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

void * UNPK_openArchive(PHYSFS_Io *io)

{
  int iVar1;
  UNPKinfo *info;
  PHYSFS_Io *io_local;
  
  io_local = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x28);
  if (io_local == (PHYSFS_Io *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    io_local = (PHYSFS_Io *)0x0;
  }
  else {
    iVar1 = __PHYSFS_DirTreeInit((__PHYSFS_DirTree *)io_local,0x48);
    if (iVar1 == 0) {
      (*__PHYSFS_AllocatorHooks.Free)(io_local);
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      io_local->seek = (_func_int_PHYSFS_Io_ptr_PHYSFS_uint64 *)io;
    }
  }
  return io_local;
}

Assistant:

void *UNPK_openArchive(PHYSFS_Io *io)
{
    UNPKinfo *info = (UNPKinfo *) allocator.Malloc(sizeof (UNPKinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    if (!__PHYSFS_DirTreeInit(&info->tree, sizeof (UNPKentry)))
    {
        allocator.Free(info);
        return NULL;
    } /* if */

    info->io = io;

    return info;
}